

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O1

void __thiscall
amrex::AmrMesh::MakeNewGrids
          (AmrMesh *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Box *pBVar2;
  IntVect *pIVar3;
  int iVar4;
  pointer pGVar5;
  pointer pBVar6;
  long *plVar7;
  pointer pBVar8;
  pointer pBVar9;
  undefined8 uVar10;
  pointer pBVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  BoxList *__x;
  long lVar16;
  int iVar17;
  pointer pIVar18;
  uint uVar19;
  int iVar20;
  undefined8 *puVar21;
  pointer pIVar22;
  undefined8 *puVar23;
  pointer pIVar24;
  ulong uVar25;
  int n_1;
  long lVar26;
  int n;
  long lVar27;
  long lVar28;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar29;
  int iVar30;
  int dir;
  int iVar31;
  int iVar32;
  byte bVar33;
  IntVect ngt;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> bf_lev;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> pc_domain;
  BoxList new_bx;
  PinnedVector<IntVect> tagvec;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_comp_ba;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> rr_lev;
  BoxList bl;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_ba;
  Box result;
  ClusterList clist;
  BoxArray ba_proj;
  BoxList local_448;
  long local_420;
  IntVect local_418;
  BoxList local_408;
  long local_3e8;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_3e0;
  long local_3d8;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_3d0;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_3b8;
  int local_39c;
  BoxList local_398;
  PinnedVector<IntVect> local_378;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_358;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_340;
  Real local_328;
  BoxList local_320;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_300;
  FabArray<amrex::TagBox> local_2e8;
  Geometry local_160;
  BoxArray local_98;
  
  bVar33 = 0;
  iVar32 = (this->super_AmrInfo).max_level;
  iVar30 = iVar32 + -1;
  iVar31 = *(int *)&(this->super_AmrInfo).field_0x8c;
  if (iVar31 <= iVar30) {
    iVar30 = iVar31;
  }
  local_328 = time;
  if (((long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 < (long)(iVar30 + 2)) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              (&new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)(iVar30 + 2));
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&local_3d0,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&local_340,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&local_3b8,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  if (-1 < iVar30) {
    pIVar18 = (this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar24 = (this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar25 = 0;
    pIVar22 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pIVar24 = pIVar24 + 1;
      lVar27 = 0;
      do {
        iVar13 = pIVar24->vect[lVar27] / pIVar18->vect[lVar27];
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        pIVar22->vect[lVar27] = iVar13;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      uVar25 = uVar25 + 1;
      pIVar22 = pIVar22 + 1;
      pIVar18 = pIVar18 + 1;
    } while (uVar25 != iVar30 + 1);
  }
  if (lbase < iVar30) {
    lVar27 = (long)lbase;
    pIVar24 = local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27;
    pIVar22 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27;
    pIVar18 = (this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27;
    do {
      lVar26 = 0;
      do {
        pIVar24->vect[lVar26] =
             (pIVar22->vect[lVar26] * pIVar18->vect[lVar26]) / pIVar22[1].vect[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      lVar27 = lVar27 + 1;
      pIVar24 = pIVar24 + 1;
      pIVar22 = pIVar22 + 1;
      pIVar18 = pIVar18 + 1;
    } while (lVar27 != iVar30);
  }
  if (lbase <= iVar30) {
    lVar27 = (long)lbase;
    pIVar18 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27;
    do {
      pGVar5 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar24 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar27;
      pBVar2 = &pGVar5[lVar27].domain;
      pBVar9 = *(pointer *)&pBVar2->smallend;
      lVar26 = *(long *)((pBVar2->smallend).vect + 2);
      pIVar3 = &pGVar5[lVar27].domain.bigend;
      lVar16 = *(long *)pIVar3->vect;
      uVar10 = *(undefined8 *)(pIVar3->vect + 2);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
           SUB84((ulong)lVar16 >> 0x20,0);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar10
      ;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
           (int)((ulong)uVar10 >> 0x20);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = (BATType)lVar26;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           SUB84((ulong)lVar26 >> 0x20,0);
      iVar13 = pIVar24->vect[0];
      iVar15 = pIVar24->vect[1];
      if ((iVar15 != 1 || iVar13 != 1) ||
         (local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)pBVar9,
         pIVar24->vect[2] != 1)) {
        local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ = (uint)pBVar9;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase + 1;
              uVar19 = -(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
              if (0 < (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase) {
                uVar19 = (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
              }
              uVar19 = uVar19 >> 2;
LAB_004e3248:
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ = ~uVar19;
            }
            else {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 2;
            }
          }
          else if (iVar13 == 2) {
            if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase + 1;
              uVar19 = -(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
              if (0 < (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase) {
                uVar19 = (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
              }
              uVar19 = uVar19 >> 1;
              goto LAB_004e3248;
            }
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                 (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 1;
          }
          else if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
            iVar20 = (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase + 1;
            iVar4 = -iVar20;
            if (0 < iVar20) {
              iVar4 = iVar20;
            }
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ = ~(iVar4 / iVar13);
          }
          else {
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                 (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase / iVar13;
          }
        }
        local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ = (uint)((ulong)pBVar9 >> 0x20);
        if (iVar15 != 1) {
          if (iVar15 == 4) {
            if ((long)pBVar9 < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                   local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ + 1;
              uVar19 = -local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_;
              if (0 < (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_) {
                uVar19 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_;
              }
              uVar19 = uVar19 >> 2;
LAB_004e32ae:
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ = ~uVar19;
            }
            else {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                   local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 2;
            }
          }
          else if (iVar15 == 2) {
            if ((long)pBVar9 < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                   local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ + 1;
              uVar19 = -local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_;
              if (0 < (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_) {
                uVar19 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_;
              }
              uVar19 = uVar19 >> 1;
              goto LAB_004e32ae;
            }
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                 local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 1;
          }
          else if ((long)pBVar9 < 0) {
            iVar20 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ + 1;
            iVar4 = -iVar20;
            if (0 < iVar20) {
              iVar4 = iVar20;
            }
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ = ~(iVar4 / iVar15);
          }
          else {
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
                 (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ / iVar15;
          }
        }
        iVar4 = pIVar24->vect[2];
        if (iVar4 != 1) {
          if (iVar4 == 4) {
            if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
              uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type + indexType;
              uVar19 = -uVar14;
              if (0 < (int)uVar14) {
                uVar19 = uVar14;
              }
              uVar19 = uVar19 >> 2;
LAB_004e331c:
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = ~uVar19;
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 2;
            }
          }
          else if (iVar4 == 2) {
            if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
              uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type + indexType;
              uVar19 = -uVar14;
              if (0 < (int)uVar14) {
                uVar19 = uVar14;
              }
              uVar19 = uVar19 >> 1;
              goto LAB_004e331c;
            }
            local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 1;
          }
          else if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
            iVar17 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type + indexType;
            iVar20 = -iVar17;
            if (0 < iVar17) {
              iVar20 = iVar17;
            }
            local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = ~(iVar20 / iVar4);
          }
          else {
            local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                 (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type / iVar4;
          }
        }
        if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] == 0) {
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              if (lVar26 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e3595:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                     (BATindexType)~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                     (BATindexType)
                     ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                     >> 2);
              }
            }
            else if (iVar13 == 2) {
              if (lVar26 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e3595;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)
                   ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                   >> 1);
            }
            else if (lVar26 < 0) {
              iVar17 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       + 1;
              iVar20 = -iVar17;
              if (0 < iVar17) {
                iVar20 = iVar17;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)~(iVar20 / iVar13);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)
                   ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype /
                   iVar13);
            }
          }
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              if (lVar16 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e35fb:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)
                     ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                     >> 2);
              }
            }
            else if (iVar15 == 2) {
              if (lVar16 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e35fb;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)
                   ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype >>
                   1);
            }
            else if (lVar16 < 0) {
              iVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       + 1;
              iVar13 = -iVar20;
              if (0 < iVar20) {
                iVar13 = iVar20;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)~(iVar13 / iVar15);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)
                   ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype /
                   iVar15);
            }
          }
          if (iVar4 != 1) {
            if (iVar4 == 4) {
              if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] <
                  0) {
                uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e3672:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                     ~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                     (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                           vect[0] >> 2;
              }
            }
            else if (iVar4 == 2) {
              if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] <
                  0) {
                uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e3672;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] >> 1;
            }
            else if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0] < 0) {
              iVar15 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] + 1;
              iVar13 = -iVar15;
              if (0 < iVar15) {
                iVar13 = iVar15;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   ~(iVar13 / iVar4);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0]
                   / iVar4;
            }
          }
        }
        else {
          local_160.super_CoordSys.c_sys = cartesian;
          local_160.super_CoordSys._4_4_ = 0;
          local_160.super_CoordSys.offset[0]._0_4_ = 0;
          lVar28 = 0;
          do {
            if ((((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                        vect[1] >> ((uint)lVar28 & 0x1f) & 1) != 0) &&
               (*(int *)((long)&local_2e8.super_FabArrayBase.boxarray.m_bat.m_op + lVar28 * 4) %
                pIVar18->vect[lVar28] != 0)) {
              *(undefined4 *)((long)local_160.super_CoordSys.offset + lVar28 * 4 + -8) = 1;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              if (lVar26 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e342e:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                     (BATindexType)~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                     (BATindexType)
                     ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                     >> 2);
              }
            }
            else if (iVar13 == 2) {
              if (lVar26 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e342e;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)
                   ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                   >> 1);
            }
            else if (lVar26 < 0) {
              iVar17 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       + 1;
              iVar20 = -iVar17;
              if (0 < iVar17) {
                iVar20 = iVar17;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)~(iVar20 / iVar13);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
                   (BATindexType)
                   ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype /
                   iVar13);
            }
          }
          if (iVar15 != 1) {
            if (iVar15 == 4) {
              if (lVar16 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e3496:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                     (IndexType)
                     ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                     >> 2);
              }
            }
            else if (iVar15 == 2) {
              if (lVar16 < 0) {
                uVar14 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e3496;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)
                   ((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype >>
                   1);
            }
            else if (lVar16 < 0) {
              iVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       + 1;
              iVar13 = -iVar20;
              if (0 < iVar20) {
                iVar13 = iVar20;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)~(iVar13 / iVar15);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)
                   ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype /
                   iVar15);
            }
          }
          if (iVar4 != 1) {
            if (iVar4 == 4) {
              if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] <
                  0) {
                uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 2;
LAB_004e3500:
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                     ~uVar19;
              }
              else {
                local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                     (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                           vect[0] >> 2;
              }
            }
            else if (iVar4 == 2) {
              if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] <
                  0) {
                uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] + 1;
                uVar19 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar19 = uVar14;
                }
                uVar19 = uVar19 >> 1;
                goto LAB_004e3500;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                         vect[0] >> 1;
            }
            else if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0] < 0) {
              iVar15 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] + 1;
              iVar13 = -iVar15;
              if (0 < iVar15) {
                iVar13 = iVar15;
              }
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   ~(iVar13 / iVar4);
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0]
                   / iVar4;
            }
          }
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
               (BATindexType)
               ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype +
               local_160.super_CoordSys.c_sys);
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
               (IndexType)
               ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype +
               local_160.super_CoordSys._4_4_);
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
               local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] +
               local_160.super_CoordSys.offset[0]._0_4_;
        }
      }
      *(ulong *)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27].bigend.vect =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype,
                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype);
      *(ulong *)(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27].bigend.vect + 2) =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1]
                    ,local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0]);
      *(_func_int ***)
       local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
       super__Vector_impl_data._M_start[lVar27].smallend.vect =
           local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      *(ulong *)(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27].smallend.vect + 2) =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype,
                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      lVar27 = lVar27 + 1;
      pIVar18 = pIVar18 + 1;
    } while (iVar30 + 1 != (int)lVar27);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_300,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_358,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  BoxList::BoxList(&local_408);
  BoxList::BoxList(&local_448);
  local_420 = (long)lbase;
  local_3e8 = local_420 * 0x68;
  __x = BoxArray::simplified_list
                  ((this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + local_420);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_320,
             (vector<amrex::Box,_std::allocator<amrex::Box>_> *)__x);
  local_320.btype.itype = (__x->btype).itype;
  BoxList::coarsen(&local_320,
                   local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_start + local_420);
  lVar27 = local_420;
  BoxList::parallelComplementIn
            (&local_448,
             local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start + local_420,&local_320);
  BoxList::clear(&local_320);
  BoxList::simplify(&local_448,false);
  BoxList::accrete(&local_448,(this->super_AmrInfo).n_proper);
  pGVar5 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar25 = (ulong)(byte)pGVar5[local_420].super_CoordSys.field_0x51;
  if (((uVar25 != 0) || (pGVar5[local_420].super_CoordSys.field_0x52 != '\0')) ||
     (pGVar5[local_420].super_CoordSys.field_0x53 == '\x01')) {
    local_2e8.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)((ulong)(byte)pGVar5[local_420].super_CoordSys.field_0x52 << 0x20 | uVar25);
    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
         (BATType)(byte)pGVar5[local_420].super_CoordSys.field_0x53;
    ProjPeriodic(&local_448,
                 local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar27,(Array<int,_3> *)&local_2e8);
  }
  BoxArray::define((BoxArray *)
                   ((long)&((local_358.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   local_3e8),&local_448);
  BoxList::BoxList((BoxList *)&local_2e8);
  pBVar11 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                                itype,local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
  local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
  pBVar9 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                             m_crse_ratio.vect[0],
                             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                            );
  local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)(IndexType)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
  if (pBVar11 != (pointer)0x0) {
    uVar25 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)pBVar11;
    local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar9;
    operator_delete(pBVar11,uVar25);
    pBVar9 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pBVar9;
  local_448.btype.itype =
       local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
  if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
    operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                    CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                             m_crse_ratio.vect[0],
                             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                            ) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
  }
  BoxList::parallelComplementIn
            (&local_408,
             local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start + lVar27,
             (BoxArray *)
             ((long)&((local_358.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start)->m_bat).m_bat_type + local_3e8));
  BoxList::simplify(&local_408,false);
  BoxArray::define((BoxArray *)
                   ((long)&((local_300.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   local_3e8),&local_408);
  BoxList::BoxList((BoxList *)&local_2e8);
  pBVar11 = local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                                itype,local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
  local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
  pBVar9 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                             m_crse_ratio.vect[0],
                             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                            );
  local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)(IndexType)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
  local_3d8 = (long)iVar31;
  if (pBVar11 != (pointer)0x0) {
    uVar25 = (long)local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)pBVar11;
    local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar9;
    operator_delete(pBVar11,uVar25);
    pBVar9 = local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pBVar9;
  local_408.btype.itype =
       local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
  local_3e0 = new_grids;
  if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
    operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                    CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                             m_crse_ratio.vect[0],
                             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                            ) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
  }
  iVar31 = iVar30 - lbase;
  if (iVar31 != 0 && lbase <= iVar30) {
    lVar16 = (long)lbase;
    lVar28 = lVar16 * 200 + 0x11b;
    lVar26 = lVar16 * 0xc;
    lVar27 = lVar16 * 0x1c;
    lVar16 = lVar16 * 0x68;
    do {
      BoxArray::boxList((BoxList *)&local_2e8,
                        (BoxArray *)
                        ((long)&((local_358.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                        lVar16));
      pBVar11 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar9 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar11 != (pointer)0x0) {
        uVar25 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar11;
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar9;
        operator_delete(pBVar11,uVar25);
        pBVar9 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pBVar9;
      local_448.btype.itype =
           local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
        operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                        CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
      }
      BoxList::simplify(&local_448,false);
      BoxList::refine(&local_448,
                      (IntVect *)
                      ((long)(local_340.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar26));
      BoxList::accrete(&local_448,(this->super_AmrInfo).n_proper);
      pGVar5 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar25 = (ulong)*(byte *)((long)(pGVar5->super_CoordSys).offset + lVar28 + 0xfffffffffffffff6U
                               );
      if (((uVar25 != 0) ||
          (*(char *)((long)(pGVar5->super_CoordSys).offset + lVar28 + 0xfffffffffffffff7U) != '\0'))
         || (*(char *)((long)(pGVar5->super_CoordSys).offset + lVar28 + -8) == '\x01')) {
        local_2e8.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)
             ((ulong)*(byte *)((long)(pGVar5->super_CoordSys).offset + lVar28 + 0xfffffffffffffff7U)
              << 0x20 | uVar25);
        local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
             (BATType)*(byte *)((long)(pGVar5->super_CoordSys).offset + lVar28 + -8);
        ProjPeriodic(&local_448,
                     (Box *)((long)local_3b8.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start[1].smallend.vect +
                            lVar27),(Array<int,_3> *)&local_2e8);
      }
      BoxArray::define((BoxArray *)
                       ((long)&local_358.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                       lVar16),&local_448);
      BoxList::BoxList((BoxList *)&local_2e8);
      pBVar11 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar9 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar11 != (pointer)0x0) {
        uVar25 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar11;
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar9;
        operator_delete(pBVar11,uVar25);
        pBVar9 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pBVar9;
      local_448.btype.itype =
           local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
        operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                        CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
      }
      BoxList::parallelComplementIn
                (&local_408,
                 (Box *)((long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].smallend.vect + lVar27),
                 (BoxArray *)
                 ((long)&local_358.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar16));
      BoxList::simplify(&local_408,false);
      BoxArray::define((BoxArray *)
                       ((long)&local_300.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                       lVar16),&local_408);
      BoxList::BoxList((BoxList *)&local_2e8);
      pBVar11 = local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar9 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar11 != (pointer)0x0) {
        uVar25 = (long)local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar11;
        local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar9;
        operator_delete(pBVar11,uVar25);
        pBVar9 = local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pBVar9;
      local_408.btype.itype =
           local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
        operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                        CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                 m_crse_ratio.vect[0],
                                 local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                 itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
      }
      lVar28 = lVar28 + 200;
      lVar26 = lVar26 + 0xc;
      iVar31 = iVar31 + -1;
      lVar27 = lVar27 + 0x1c;
      lVar16 = lVar16 + 0x68;
    } while (iVar31 != 0);
  }
  *new_finest = lbase;
  if (lbase <= iVar30) {
    local_39c = 0;
    lVar27 = (long)iVar32 + -1;
    if (local_3d8 <= lVar27) {
      lVar27 = local_3d8;
    }
    local_3d8 = lVar27 * 0xc;
    do {
      pIVar18 = (this->super_AmrInfo).n_error_buf.
                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_418.vect[2] = pIVar18[lVar27].vect[2];
      local_418.vect._0_8_ = *(undefined8 *)pIVar18[lVar27].vect;
      BoxArray::BoxArray(&local_98);
      lVar26 = lVar27 + 1;
      if (lVar26 < *new_finest) {
        BoxArray::simplified
                  ((BoxArray *)&local_2e8,
                   (local_3e0->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27 + 2);
        BoxArray::operator=(&local_98,(BoxArray *)&local_2e8);
        BoxArray::~BoxArray((BoxArray *)&local_2e8);
        BoxArray::coarsen(&local_98,
                          (this->super_AmrInfo).ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar26);
        BoxArray::growcoarsen
                  (&local_98,(this->super_AmrInfo).n_proper,
                   (this->super_AmrInfo).ref_ratio.
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27);
        BoxArray::simplified
                  ((BoxArray *)&local_2e8,
                   (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27);
        iVar32 = 0;
        while( true ) {
          local_160.super_CoordSys.c_sys = cartesian;
          local_160.super_CoordSys._4_4_ = 0;
          local_160.super_CoordSys.offset[0]._0_4_ = 0;
          bVar12 = BoxArray::contains((BoxArray *)&local_2e8,&local_98,false,(IntVect *)&local_160);
          if (bVar12) break;
          BoxArray::grow((BoxArray *)&local_2e8,1);
          iVar32 = iVar32 + 1;
        }
        if (local_418.vect[0] <= iVar32) {
          local_418.vect[0] = iVar32;
        }
        if (local_418.vect[1] <= iVar32) {
          local_418.vect[1] = iVar32;
        }
        if (iVar32 < local_418.vect[2]) {
          iVar32 = local_418.vect[2];
        }
        local_418.vect[2] = iVar32;
        BoxArray::~BoxArray((BoxArray *)&local_2e8);
      }
      TagBoxArray::TagBoxArray
                ((TagBoxArray *)&local_2e8,
                 (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar27,
                 (this->dmap).
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 .
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar27,&local_418);
      if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
         ((this->super_AmrInfo).use_fixed_upto_level <= lVar27)) {
        (*this->_vptr_AmrMesh[3])(SUB84(local_328,0),this,lVar27,&local_2e8);
      }
      TagBoxArray::buffer((TagBoxArray *)&local_2e8,
                          (this->super_AmrInfo).n_error_buf.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar27);
      iVar32 = (int)lVar26;
      if ((this->super_AmrInfo).use_fixed_coarse_grids == true) {
        if (lVar27 < (this->super_AmrInfo).use_fixed_upto_level) {
          iVar31 = *new_finest;
          if (*new_finest <= iVar32) {
            iVar31 = iVar32;
          }
          *new_finest = iVar31;
        }
        else {
          (*this->_vptr_AmrMesh[6])(&local_160,this);
          TagBoxArray::setVal((TagBoxArray *)&local_2e8,(BoxArray *)&local_160,CLEAR);
          BoxArray::~BoxArray((BoxArray *)&local_160);
        }
      }
      lVar16 = 0;
      iVar31 = 0;
      do {
        iVar30 = *(int *)((long)(local_3d0.
                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vect +
                         lVar16 * 4 + local_3d8);
        if (iVar30 < iVar31) {
          iVar30 = iVar31;
        }
        iVar31 = iVar30;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      if (iVar31 < 1) {
        Abort_host("blocking factor is too small relative to ref_ratio");
      }
      else {
        TagBoxArray::coarsen
                  ((TagBoxArray *)&local_2e8,
                   local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar27);
      }
      (*this->_vptr_AmrMesh[4])(this,lVar27,&local_2e8,&local_3d0);
      if (lVar26 < *new_finest) {
        BoxArray::coarsen(&local_98,
                          local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar27);
        TagBoxArray::setVal((TagBoxArray *)&local_2e8,&local_98,SET);
      }
      pGVar5 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start + lVar27;
      local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)(byte)(pGVar5->super_CoordSys).field_0x52 << 0x20 |
                          (ulong)(byte)(pGVar5->super_CoordSys).field_0x51);
      local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = (uint)(byte)(pGVar5->super_CoordSys).field_0x53;
      Geometry::Geometry(&local_160,
                         local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar27,&pGVar5->prob_domain,
                         (pGVar5->super_CoordSys).c_sys,(Array<int,_3> *)&local_398);
      TagBoxArray::mapPeriodicRemoveDuplicates((TagBoxArray *)&local_2e8,&local_160);
      TagBoxArray::setVal((TagBoxArray *)&local_2e8,
                          local_358.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar27,CLEAR);
      BoxArray::clear(local_358.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar27);
      local_378.m_data = (IntVect *)0x0;
      local_378.m_size = 0;
      local_378.m_capacity = 0;
      TagBoxArray::collate((TagBoxArray *)&local_2e8,&local_378);
      FabArray<amrex::TagBox>::clear(&local_2e8);
      if (local_378.m_size != 0) {
        if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
           ((this->super_AmrInfo).use_fixed_upto_level <= lVar27)) {
          iVar31 = *new_finest;
          if (*new_finest <= iVar32) {
            iVar31 = iVar32;
          }
          *new_finest = iVar31;
        }
        if ((this->super_AmrInfo).use_fixed_upto_level <= lVar27) {
          BoxList::BoxList(&local_398);
          if (*(int *)(ParallelContext::frames + 0xc) == local_39c) {
            ClusterList::ClusterList((ClusterList *)&local_160,local_378.m_data,local_378.m_size);
            if ((this->super_AmrInfo).use_new_chop == true) {
              ClusterList::new_chop((ClusterList *)&local_160,(this->super_AmrInfo).grid_eff);
            }
            else {
              ClusterList::chop((ClusterList *)&local_160,(this->super_AmrInfo).grid_eff);
            }
            ClusterList::intersect
                      ((ClusterList *)&local_160,
                       local_300.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar27);
            ClusterList::boxList((ClusterList *)&local_160,&local_398);
            BoxList::refine(&local_398,
                            local_3d0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar27);
            BoxList::simplify(&local_398,false);
            if ((pointer)CONCAT44(local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (uint)local_398.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_finish) !=
                local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start &&
                -1 < (long)CONCAT44(local_398.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (uint)local_398.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish) -
                     (long)local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start) {
              BoxList::intersect(&local_398,
                                 &(this->geom).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar27].domain);
            }
            ClusterList::~ClusterList((ClusterList *)&local_160);
          }
          BoxList::Bcast(&local_398);
          BoxList::refine(&local_398,
                          (this->super_AmrInfo).ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar27);
          BoxArray::BoxArray((BoxArray *)&local_160,&local_398,
                             (this->super_AmrInfo).max_grid_size.
                             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar26);
          BoxArray::operator=((local_3e0->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar26,
                              (BoxArray *)&local_160);
          BoxArray::~BoxArray((BoxArray *)&local_160);
          if (local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      if (local_378.m_data != (IntVect *)0x0) {
        operator_delete(local_378.m_data,local_378.m_capacity * 0xc);
      }
      FabArray<amrex::TagBox>::~FabArray(&local_2e8);
      BoxArray::~BoxArray(&local_98);
      local_3d8 = local_3d8 + -0xc;
      bVar12 = local_420 < lVar27;
      lVar27 = lVar27 + -1;
    } while (bVar12);
  }
  if (lbase < *new_finest) {
    lVar26 = local_3e8 + 200;
    pVVar29 = local_3e0;
    lVar27 = local_420;
    do {
      lbase = lbase + 1;
      lVar27 = lVar27 + 1;
      pBVar6 = (pVVar29->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar7 = *(long **)((long)pBVar6 + lVar26 + -0x18);
      if (*plVar7 == plVar7[1]) {
        if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
           ((this->super_AmrInfo).use_fixed_upto_level <= lVar27)) {
          Abort_host("AmrMesh::MakeNewGrids: how did this happen?");
        }
      }
      else if ((this->super_AmrInfo).refine_grid_layout == true) {
        ChopGrids(this,lbase,(BoxArray *)((long)pBVar6 + lVar26 + -0x60),
                  *(int *)(ParallelContext::frames + 0x10));
        bVar12 = BoxArray::operator==
                           ((BoxArray *)
                            ((long)(pVVar29->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar26 + -0x60),
                            (BoxArray *)
                            ((long)(this->grids).
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar26 + -0x60));
        if (bVar12) {
          pBVar6 = (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar8 = (pVVar29->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pBVar8 + lVar26 + -0x60);
          puVar21 = (undefined8 *)((long)pBVar6 + lVar26 + -0x60);
          puVar23 = puVar1;
          for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
            *puVar23 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
            puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
          }
          puVar1[9] = *(undefined8 *)((long)pBVar6 + lVar26 + -0x18);
          this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)pBVar8 + lVar26 + -0x10);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             ((long)pBVar6 + lVar26 + -0x10));
          pVVar29 = local_3e0;
          this_00[1]._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pBVar6 + lVar26 + -8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pBVar8->m_bat).m_bat_type + lVar26),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pBVar6->m_bat).m_bat_type + lVar26));
        }
      }
      lVar26 = lVar26 + 0x68;
    } while (lVar27 < *new_finest);
  }
  if (local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_358);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_300);
  if (local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
AmrMesh::MakeNewGrids (int lbase, Real time, int& new_finest, Vector<BoxArray>& new_grids)
{
    BL_PROFILE("AmrMesh::MakeNewGrids()");

    BL_ASSERT(lbase < max_level);

    // Add at most one new level
    int max_crse = std::min(finest_level, max_level-1);

    if (new_grids.size() < max_crse+2) new_grids.resize(max_crse+2);

    //
    // Construct problem domain at each level.
    //
    Vector<IntVect> bf_lev(max_level); // Blocking factor at each level.
    Vector<IntVect> rr_lev(max_level);
    Vector<Box>     pc_domain(max_level);  // Coarsened problem domain.

    for (int i = 0; i <= max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bf_lev[i][n] = std::max(1,blocking_factor[i+1][n]/ref_ratio[i][n]);
        }
    }
    for (int i = lbase; i < max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            // Note that in AmrMesh we check that
            // ref ratio * coarse blocking factor >= fine blocking factor
            rr_lev[i][n] = (ref_ratio[i][n]*bf_lev[i][n])/bf_lev[i+1][n];
        }
    }
    for (int i = lbase; i <= max_crse; i++) {
        pc_domain[i] = amrex::coarsen(Geom(i).Domain(),bf_lev[i]);
    }
    //
    // Construct proper nesting domains.
    //
    Vector<BoxArray> p_n_ba(max_level); // Proper nesting domain.
    Vector<BoxArray> p_n_comp_ba(max_level); // Complement proper nesting domain.
    BoxList p_n, p_n_comp;

    BoxList bl = grids[lbase].simplified_list();
    bl.coarsen(bf_lev[lbase]);
    p_n_comp.parallelComplementIn(pc_domain[lbase],bl);
    bl.clear();
    p_n_comp.simplify();
    p_n_comp.accrete(n_proper);
    if (geom[lbase].isAnyPeriodic()) {
        ProjPeriodic(p_n_comp, pc_domain[lbase], geom[lbase].isPeriodic());
    }

    p_n_comp_ba[lbase].define(std::move(p_n_comp));
    p_n_comp = BoxList();

    p_n.parallelComplementIn(pc_domain[lbase],p_n_comp_ba[lbase]);
    p_n.simplify();

    p_n_ba[lbase].define(std::move(p_n));
    p_n = BoxList();

    for (int i = lbase+1; i <= max_crse; i++)
    {
        p_n_comp = p_n_comp_ba[i-1].boxList();

        // Need to simplify p_n_comp or the number of grids can too large for many levels.
        p_n_comp.simplify();

        p_n_comp.refine(rr_lev[i-1]);
        p_n_comp.accrete(n_proper);

        if (geom[i].isAnyPeriodic()) {
            ProjPeriodic(p_n_comp, pc_domain[i], geom[i].isPeriodic());
        }

        p_n_comp_ba[i].define(std::move(p_n_comp));
        p_n_comp = BoxList();

        p_n.parallelComplementIn(pc_domain[i],p_n_comp_ba[i]);
        p_n.simplify();

        p_n_ba[i].define(std::move(p_n));
        p_n = BoxList();
    }

    //
    // Now generate grids from finest level down.
    //
    new_finest = lbase;

    for (int levc = max_crse; levc >= lbase; levc--)
    {
        int levf = levc+1;
        //
        // Construct TagBoxArray with sufficient grow factor to contain
        // new levels projected down to this level.
        //
        IntVect ngt = n_error_buf[levc];
        BoxArray ba_proj;
        if (levf < new_finest)
        {
            ba_proj = new_grids[levf+1].simplified();
            ba_proj.coarsen(ref_ratio[levf]);
            ba_proj.growcoarsen(n_proper, ref_ratio[levc]);

            BoxArray levcBA = grids[levc].simplified();
            int ngrow = 0;
            while (!levcBA.contains(ba_proj))
            {
                levcBA.grow(1);
                ++ngrow;
            }
            ngt.max(IntVect(ngrow));
        }
        TagBoxArray tags(grids[levc],dmap[levc],ngt);

        //
        // Only use error estimation to tag cells for the creation of new grids
        //      if the grids at that level aren't already fixed.
        //

        if ( ! (useFixedCoarseGrids() && levc < useFixedUpToLevel()) ) {
            ErrorEst(levc, tags, time, 0);
        }

        //
        // Buffer error cells.
        //
        tags.buffer(n_error_buf[levc]);

        if (useFixedCoarseGrids())
        {
            if (levc>=useFixedUpToLevel())
            {
                tags.setVal(GetAreaNotToTag(levc), TagBox::CLEAR);
            }
            else
            {
                new_finest = std::max(new_finest,levf);
            }
        }

        //
        // Coarsen the taglist by blocking_factor/ref_ratio.
        //
        int bl_max = 0;
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bl_max = std::max(bl_max,bf_lev[levc][n]);
        }
        if (bl_max >= 1) {
            tags.coarsen(bf_lev[levc]);
        } else {
            amrex::Abort("blocking factor is too small relative to ref_ratio");
        }
        //
        // Remove or add tagged points which violate/satisfy additional
        // user-specified criteria.
        //
        ManualTagsPlacement(levc, tags, bf_lev);
        //
        // If new grids have been constructed above this level, project
        // those grids down and tag cells on intersections to ensure
        // proper nesting.
        //
        if (levf < new_finest) {
            ba_proj.coarsen(bf_lev[levc]);
            tags.setVal(ba_proj,TagBox::SET);
        }
        //
        // Map tagged points through periodic boundaries, if any.
        //
        tags.mapPeriodicRemoveDuplicates(Geometry(pc_domain[levc],
                                                  Geom(levc).ProbDomain(),
                                                  Geom(levc).CoordInt(),
                                                  Geom(levc).isPeriodic()));
        //
        // Remove cells outside proper nesting domain for this level.
        //
        tags.setVal(p_n_comp_ba[levc],TagBox::CLEAR);
        p_n_comp_ba[levc].clear();
        //
        // Create initial cluster containing all tagged points.
        //
        Gpu::PinnedVector<IntVect> tagvec;
        tags.collate(tagvec);
        tags.clear();

        if (tagvec.size() > 0)
        {
            //
            // Created new level, now generate efficient grids.
            //
            if ( !(useFixedCoarseGrids() && levc<useFixedUpToLevel()) ) {
                new_finest = std::max(new_finest,levf);
            }

            if (levf > useFixedUpToLevel()) {
                BoxList new_bx;
                if (ParallelDescriptor::IOProcessor()) {
                    BL_PROFILE("AmrMesh-cluster");
                    //
                    // Construct initial cluster.
                    //
                    ClusterList clist(&tagvec[0], tagvec.size());
                    if (use_new_chop) {
                        clist.new_chop(grid_eff);
                    } else {
                        clist.chop(grid_eff);
                    }
                    clist.intersect(p_n_ba[levc]);
                    //
                    // Efficient properly nested Clusters have been constructed
                    // now generate list of grids at level levf.
                    //
                    clist.boxList(new_bx);
                    new_bx.refine(bf_lev[levc]);
                    new_bx.simplify();

                    if (new_bx.size()>0) {
                        // Chop new grids outside domain
                        new_bx.intersect(Geom(levc).Domain());
                    }
                }
                new_bx.Bcast();  // Broadcast the new BoxList to other processes

                //
                // Refine up to levf.
                //
                new_bx.refine(ref_ratio[levc]);
                BL_ASSERT(new_bx.isDisjoint());

                new_grids[levf] = BoxArray(std::move(new_bx), max_grid_size[levf]);
            }
        }
    }

#if 0
    if (!useFixedCoarseGrids()) {
        // check proper nesting
        // This check does not consider periodic boundary and could fail if
        // the blocking factor is not the same on all levels.
        for (int lev = lbase+1; lev <= new_finest; ++lev) {
            BoxArray const& cba = (lev == lbase+1) ? grids[lev-1] : new_grids[lev-1];
            BoxArray const& fba = amrex::coarsen(new_grids[lev],ref_ratio[lev-1]);
            IntVect np = bf_lev[lev-1] * n_proper;
            Box const& cdomain = Geom(lev-1).Domain();
            for (int i = 0, N = fba.size(); i < N; ++i) {
                Box const& fb = amrex::grow(fba[i],np) & cdomain;
                if (!cba.contains(fb,true)) {
                    amrex::Abort("AmrMesh::MakeNewGrids: new grids not properly nested");
                }
            }
        }
    }
#endif

    for (int lev = lbase+1; lev <= new_finest; ++lev) {
        if (new_grids[lev].empty())
        {
            if (!(useFixedCoarseGrids() && lev<useFixedUpToLevel()) ) {
                amrex::Abort("AmrMesh::MakeNewGrids: how did this happen?");
            }
        }
        else if (refine_grid_layout)
        {
            ChopGrids(lev,new_grids[lev],ParallelDescriptor::NProcs());
            if (new_grids[lev] == grids[lev]) {
                new_grids[lev] = grids[lev]; // to avoid duplicates
            }
        }
    }
}